

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

natwm_error string_splice(char *string,size_t start,size_t end,char **destination,size_t *size)

{
  size_t sVar1;
  char *pcVar2;
  size_t result_size;
  size_t *size_local;
  char **destination_local;
  size_t end_local;
  size_t start_local;
  char *string_local;
  
  if (((string != (char *)0x0) && (start <= end)) && (sVar1 = strlen(string), end <= sVar1)) {
    sVar1 = end - start;
    pcVar2 = (char *)malloc(sVar1 + 1);
    *destination = pcVar2;
    if (*destination == (char *)0x0) {
      return MEMORY_ALLOCATION_ERROR;
    }
    memcpy(*destination,string + start,sVar1);
    (*destination)[sVar1] = '\0';
    if (size != (size_t *)0x0) {
      *size = sVar1;
    }
    return NO_ERROR;
  }
  return INVALID_INPUT_ERROR;
}

Assistant:

enum natwm_error string_splice(const char *string, size_t start, size_t end, char **destination,
                               size_t *size)
{
        if (string == NULL || end < start || end > strlen(string)) {
                return INVALID_INPUT_ERROR;
        }

        size_t result_size = end - start;

        *destination = malloc(result_size + 1);

        if (*destination == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        memcpy(*destination, string + start, result_size);

        (*destination)[result_size] = '\0';

        SET_IF_NON_NULL(size, result_size);

        return NO_ERROR;
}